

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bridges_articulations.cpp
# Opt level: O0

void find_bridges_and_articulations(void)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  reference __k;
  reference piVar4;
  mapped_type *pmVar5;
  ulong uVar6;
  reference pvVar7;
  size_type sVar8;
  reference pvVar9;
  iterator iVar10;
  _Bit_iterator __first;
  _Bit_iterator __last;
  undefined1 auStack_b8 [4];
  int comp_size;
  int local_a8;
  bool local_a1;
  int j;
  uint local_98;
  _Bit_type *local_90;
  uint local_88;
  _Bit_type *local_80;
  uint local_78;
  _Bit_type *local_70;
  uint local_68;
  int local_5c;
  iterator iStack_58;
  int cur;
  iterator __end1_1;
  iterator __begin1_1;
  vector<int,_std::allocator<int>_> *__range1_1;
  pair<int,_int> *bridge;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *__range1;
  int local_c;
  int i;
  
  freopen("bridges_and_articulations.txt","w",_stdout);
  std::vector<bool,_std::allocator<bool>_>::resize
            ((vector<bool,_std::allocator<bool>_> *)(anonymous_namespace)::used,(long)V,false);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::tin,(long)V);
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::fout,(long)V);
  for (local_c = 0; local_c < V; local_c = local_c + 1) {
    ___range1 = std::vector<bool,_std::allocator<bool>_>::operator[]
                          ((vector<bool,_std::allocator<bool>_> *)(anonymous_namespace)::used,
                           (long)local_c);
    bVar1 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&__range1);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      dfs(local_c,-1);
    }
  }
  poVar3 = std::operator<<((ostream *)&std::cout,"Bridges:");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  __end1 = std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::begin
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                      (anonymous_namespace)::bridges);
  bridge = (pair<int,_int> *)
           std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::end
                     ((vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> *)
                      (anonymous_namespace)::bridges);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
                                     *)&bridge), bVar1) {
    __k = __gnu_cxx::
          __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
          ::operator*(&__end1);
    pmVar5 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&name_abi_cxx11_,&__k->first);
    poVar3 = std::operator<<((ostream *)&std::cout,(string *)pmVar5);
    poVar3 = std::operator<<(poVar3," (");
    iVar2 = count_from(__k->first,__k->second,true);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    poVar3 = std::operator<<(poVar3,") - ");
    pmVar5 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&name_abi_cxx11_,&__k->second);
    poVar3 = std::operator<<(poVar3,(string *)pmVar5);
    poVar3 = std::operator<<(poVar3," (");
    iVar2 = count_from(__k->second,__k->first,true);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
    std::operator<<(poVar3,")\n");
    __gnu_cxx::
    __normal_iterator<std::pair<int,_int>_*,_std::vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>_>
    ::operator++(&__end1);
  }
  poVar3 = (ostream *)
           std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"Articulation points:");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  __end1_1 = std::vector<int,_std::allocator<int>_>::begin
                       ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::articulations);
  iStack_58 = std::vector<int,_std::allocator<int>_>::end
                        ((vector<int,_std::allocator<int>_> *)(anonymous_namespace)::articulations);
  while (bVar1 = __gnu_cxx::operator!=(&__end1_1,&stack0xffffffffffffffa8), bVar1) {
    piVar4 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                       (&__end1_1);
    local_5c = *piVar4;
    pmVar5 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&name_abi_cxx11_,&local_5c);
    std::operator<<((ostream *)&std::cout,(string *)pmVar5);
    iVar10 = std::vector<bool,_std::allocator<bool>_>::begin
                       ((vector<bool,_std::allocator<bool>_> *)(anonymous_namespace)::usedcnt);
    local_80 = iVar10.super__Bit_iterator_base._M_p;
    local_78 = iVar10.super__Bit_iterator_base._M_offset;
    local_70 = local_80;
    local_68 = local_78;
    iVar10 = std::vector<bool,_std::allocator<bool>_>::end
                       ((vector<bool,_std::allocator<bool>_> *)(anonymous_namespace)::usedcnt);
    _j = iVar10.super__Bit_iterator_base._M_p;
    local_98 = iVar10.super__Bit_iterator_base._M_offset;
    local_a1 = false;
    __first.super__Bit_iterator_base._M_offset = local_68;
    __first.super__Bit_iterator_base._M_p = local_70;
    __first.super__Bit_iterator_base._12_4_ = 0;
    __last.super__Bit_iterator_base._12_4_ = 0;
    __last.super__Bit_iterator_base._M_p =
         (_Bit_type *)SUB128(iVar10.super__Bit_iterator_base._0_12_,0);
    __last.super__Bit_iterator_base._M_offset = SUB124(iVar10.super__Bit_iterator_base._0_12_,8);
    local_90 = _j;
    local_88 = local_98;
    std::fill<std::_Bit_iterator,bool>(__first,__last,&local_a1);
    local_a8 = 0;
    while( true ) {
      uVar6 = (ulong)local_a8;
      pvVar7 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&edge,(long)local_5c);
      sVar8 = std::vector<int,_std::allocator<int>_>::size(pvVar7);
      if (sVar8 <= uVar6) break;
      pvVar7 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&edge,(long)local_5c);
      pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,(long)local_a8);
      _auStack_b8 = std::vector<bool,_std::allocator<bool>_>::operator[]
                              ((vector<bool,_std::allocator<bool>_> *)(anonymous_namespace)::usedcnt
                               ,(long)*pvVar9);
      bVar1 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)auStack_b8);
      if (((bVar1 ^ 0xffU) & 1) != 0) {
        pvVar7 = std::
                 vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ::operator[](&edge,(long)local_5c);
        pvVar9 = std::vector<int,_std::allocator<int>_>::operator[](pvVar7,(long)local_a8);
        iVar2 = count_from(*pvVar9,local_5c,false);
        poVar3 = std::operator<<((ostream *)&std::cout," (");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,iVar2);
        std::operator<<(poVar3,")");
      }
      local_a8 = local_a8 + 1;
    }
    std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&__end1_1);
  }
  return;
}

Assistant:

void find_bridges_and_articulations() {
    freopen("bridges_and_articulations.txt", "w", stdout); // output file

    used.resize(V, false);
    tin.resize(V);
    fout.resize(V);

    for (int i = 0; i < V; i++)
        if (!used[i])
            dfs(i);
    
    cout << "Bridges:" << endl;
    for (const auto& bridge : bridges) {
        cout << name[bridge.first]
             << " (" << count_from(bridge.first, bridge.second)
             << ") - " << name[bridge.second]
             << " (" << count_from(bridge.second, bridge.first)
             << ")\n";
    }
    
    
    cout << endl << "Articulation points:" << endl;  
    for (int cur : articulations) {
        cout << name[cur];
        
        fill(usedcnt.begin(), usedcnt.end(), false);
            
        for (int j = 0; j < edge[cur].size(); j++) {
            if (!usedcnt[edge[cur][j]]) {
                int comp_size = count_from(edge[cur][j], cur, false); 
                cout << " (" << comp_size << ")";
            }
        }
        cout << endl;
    }
}